

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.c
# Opt level: O3

void mmk_mock_destroy_internal(mmk_mock_ctx *mock)

{
  mmk_stub *pmVar1;
  mmk_params *pmVar2;
  mmk_matcher *pmVar3;
  mmk_stub *stub;
  mmk_params *ptr;
  mmk_matcher *ptr_00;
  
  stub = mock->stubs;
  while (stub != (mmk_stub *)0x0) {
    pmVar1 = stub->next;
    mmk_stub_destroy(stub);
    stub = pmVar1;
  }
  mmk_free(mock->call_data);
  ptr = mock->params;
  while (ptr != (mmk_params *)0x0) {
    pmVar2 = ptr->next;
    ptr_00 = ptr->matcher_ctx;
    while (ptr_00 != (mmk_matcher *)0x0) {
      pmVar3 = ptr_00->next;
      mmk_free(ptr_00);
      ptr_00 = pmVar3;
    }
    mmk_free(ptr);
    ptr = pmVar2;
  }
  mmk_free(mock);
  return;
}

Assistant:

void mmk_mock_destroy_internal(struct mmk_mock_ctx *mock)
{
    for (struct mmk_stub *s = mock->stubs; s;) {
        struct mmk_stub *next = s->next;
        mmk_stub_destroy(s);
        s = next;
    }
    mmk_free(mock->call_data);
    for (struct mmk_params *p = mock->params, *pnext; p;) {
        pnext = p->next;
        for (struct mmk_matcher *m = p->matcher_ctx, *next; m;) {
            next = m->next;
            mmk_free(m);
            m = next;
        }
        mmk_free(p);
        p = pnext;
    }
    mmk_free(mock);
}